

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarType.cpp
# Opt level: O0

ostream * glu::operator<<(ostream *str,VariableDeclaration *decl)

{
  VariableDeclaration *pVVar1;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  byte bVar5;
  DeclareVariable local_70;
  int local_30;
  int bitNdx;
  VariableDeclaration *local_18;
  VariableDeclaration *decl_local;
  ostream *str_local;
  
  local_18 = decl;
  decl_local = (VariableDeclaration *)str;
  Layout::Layout((Layout *)&stack0xffffffffffffffd4,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
  bVar2 = Layout::operator!=(&decl->layout,(Layout *)&stack0xffffffffffffffd4);
  if (bVar2) {
    poVar4 = operator<<((ostream *)decl_local,&local_18->layout);
    std::operator<<(poVar4," ");
  }
  local_30 = 0;
  while (pVVar1 = decl_local, bVar5 = (byte)local_30, (1 << (bVar5 & 0x1f) & 0x1fU) != 0) {
    if ((local_18->memoryAccessQualifierBits & 1 << (bVar5 & 0x1f)) != 0) {
      pcVar3 = getMemoryAccessQualifierName(1 << (bVar5 & 0x1f));
      poVar4 = std::operator<<((ostream *)pVVar1,pcVar3);
      std::operator<<(poVar4," ");
    }
    local_30 = local_30 + 1;
  }
  if (local_18->interpolation != INTERPOLATION_LAST) {
    pcVar3 = getInterpolationName(local_18->interpolation);
    poVar4 = std::operator<<((ostream *)pVVar1,pcVar3);
    std::operator<<(poVar4," ");
  }
  pVVar1 = decl_local;
  if (local_18->storage != STORAGE_LAST) {
    pcVar3 = getStorageName(local_18->storage);
    poVar4 = std::operator<<((ostream *)pVVar1,pcVar3);
    std::operator<<(poVar4," ");
  }
  pVVar1 = decl_local;
  declare(&local_70,&local_18->varType,&local_18->name,0);
  glu::decl::operator<<((ostream *)pVVar1,&local_70);
  glu::decl::DeclareVariable::~DeclareVariable(&local_70);
  return (ostream *)decl_local;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const VariableDeclaration& decl)
{
	if (decl.layout != Layout())
		str << decl.layout << " ";

	for (int bitNdx = 0; (1 << bitNdx) & MEMORYACCESSQUALIFIER_MASK; ++bitNdx)
		if (decl.memoryAccessQualifierBits & (1 << bitNdx))
			str << getMemoryAccessQualifierName((glu::MemoryAccessQualifier)(1 << bitNdx)) << " ";

	if (decl.interpolation != INTERPOLATION_LAST)
		str << getInterpolationName(decl.interpolation) << " ";

	if (decl.storage != STORAGE_LAST)
		str << getStorageName(decl.storage) << " ";

	str << declare(decl.varType, decl.name);

	return str;
}